

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(unsigned_short lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  bool bVar1;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_RSI;
  unsigned_short in_DI;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined6 in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_8);
  bVar1 = ModulusSimpleCaseHelper<long,_unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(in_DI,in_RSI,&local_8);
  if (!bVar1) {
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffdc,(unsigned_short *)&stack0xffffffffffffffee);
    SafeInt::operator_cast_to_long
              ((SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)in_RSI.m_int);
    SVar2 = SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_DI,in_stack_ffffffffffffffe8),in_RSI.m_int);
    SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)in_RSI.m_int,
               (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT26(SVar2.m_int,in_stack_ffffffffffffffd8));
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}